

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void * __thiscall google::protobuf::DescriptorPool::Tables::AllocateBytes(Tables *this,int size)

{
  int *piVar1;
  size_t sVar2;
  int *local_30;
  int *sizep;
  void *p;
  Tables *pTStack_18;
  int size_local;
  Tables *this_local;
  
  if (size == 0) {
    this_local = (Tables *)0x0;
  }
  else {
    p._4_4_ = size;
    pTStack_18 = this;
    sVar2 = anon_unknown_24::RoundUpTo<8>(4);
    local_30 = (int *)operator_new((long)size + sVar2);
    sizep = local_30;
    std::
    vector<std::unique_ptr<int,google::protobuf::DescriptorPool::Tables::MiscDeleter>,std::allocator<std::unique_ptr<int,google::protobuf::DescriptorPool::Tables::MiscDeleter>>>
    ::emplace_back<int*&>
              ((vector<std::unique_ptr<int,google::protobuf::DescriptorPool::Tables::MiscDeleter>,std::allocator<std::unique_ptr<int,google::protobuf::DescriptorPool::Tables::MiscDeleter>>>
                *)&this->misc_allocs_,&local_30);
    piVar1 = sizep;
    *local_30 = p._4_4_;
    sVar2 = anon_unknown_24::RoundUpTo<8>(4);
    this_local = (Tables *)((long)piVar1 + sVar2);
  }
  return this_local;
}

Assistant:

void* DescriptorPool::Tables::AllocateBytes(int size) {
  if (size == 0) return nullptr;
  void* p = ::operator new(size + RoundUpTo<8>(sizeof(int)));
  int* sizep = static_cast<int*>(p);
  misc_allocs_.emplace_back(sizep);
  *sizep = size;
  return static_cast<char*>(p) + RoundUpTo<8>(sizeof(int));
}